

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_tEXt(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  LodePNGInfo *info_00;
  char *key_00;
  ulong in_RDX;
  long in_RSI;
  bool bVar1;
  uint string2_begin;
  uint length;
  uint i;
  char *str;
  char *key;
  uint error;
  uint local_48;
  uint uVar2;
  uint uVar3;
  uint local_1c;
  
  uVar2 = 0;
  while( true ) {
    bVar1 = false;
    if (uVar2 < in_RDX) {
      bVar1 = *(char *)(in_RSI + (ulong)uVar2) != '\0';
    }
    if (!bVar1) break;
    uVar2 = uVar2 + 1;
  }
  if ((uVar2 == 0) || (0x4f < uVar2)) {
    local_1c = 0x59;
  }
  else {
    info_00 = (LodePNGInfo *)lodepng_malloc(0x11a2c4);
    if (info_00 == (LodePNGInfo *)0x0) {
      local_1c = 0x53;
    }
    else {
      *(undefined1 *)((long)&info_00->compression_method + (ulong)uVar2) = 0;
      for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
        *(undefined1 *)((long)&info_00->compression_method + (ulong)uVar3) =
             *(undefined1 *)(in_RSI + (ulong)uVar3);
      }
      uVar2 = uVar2 + 1;
      if (in_RDX < uVar2) {
        local_48 = 0;
      }
      else {
        local_48 = (int)in_RDX - uVar2;
      }
      key_00 = (char *)lodepng_malloc(0x11a36b);
      if (key_00 == (char *)0x0) {
        local_1c = 0x53;
      }
      else {
        key_00[local_48] = '\0';
        for (uVar3 = 0; uVar3 != local_48; uVar3 = uVar3 + 1) {
          key_00[uVar3] = *(char *)(in_RSI + (ulong)(uVar2 + uVar3));
        }
        local_1c = lodepng_add_text(info_00,key_00,(char *)CONCAT44(uVar3,local_48));
      }
    }
  }
  lodepng_free((void *)0x11a3ee);
  lodepng_free((void *)0x11a3f8);
  return local_1c;
}

Assistant:

static unsigned readChunk_tEXt(LodePNGInfo* info, const unsigned char* data, size_t chunkLength)
{
  unsigned error = 0;
  char *key = 0, *str = 0;
  unsigned i;

  while(!error) /*not really a while loop, only used to break on error*/
  {
    unsigned length, string2_begin;

    length = 0;
    while(length < chunkLength && data[length] != 0) ++length;
    /*even though it's not allowed by the standard, no error is thrown if
    there's no null termination char, if the text is empty*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    key[length] = 0;
    for(i = 0; i != length; ++i) key[i] = (char)data[i];

    string2_begin = length + 1; /*skip keyword null terminator*/

    length = chunkLength < string2_begin ? 0 : chunkLength - string2_begin;
    str = (char*)lodepng_malloc(length + 1);
    if(!str) CERROR_BREAK(error, 83); /*alloc fail*/

    str[length] = 0;
    for(i = 0; i != length; ++i) str[i] = (char)data[string2_begin + i];

    error = lodepng_add_text(info, key, str);

    break;
  }

  lodepng_free(key);
  lodepng_free(str);

  return error;
}